

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array_ops.cpp
# Opt level: O3

Read<signed_char> __thiscall
Omega_h::interleave<signed_char>
          (Omega_h *this,
          vector<Omega_h::Read<signed_char>,_std::allocator<Omega_h::Read<signed_char>_>_> *arrays)

{
  int *piVar1;
  ulong *puVar2;
  ulong *puVar3;
  undefined8 *puVar4;
  size_t sVar5;
  Alloc *pAVar6;
  undefined8 uVar7;
  _Alloc_hider _Var8;
  ulong *puVar9;
  int iVar10;
  void *in_RDX;
  ulong uVar11;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  long lVar12;
  int n;
  ulong uVar13;
  bool bVar14;
  bool bVar15;
  Read<signed_char> RVar16;
  Write<signed_char> out;
  type f;
  value_type array;
  uint local_b0;
  Write<signed_char> local_a8;
  undefined1 local_90 [16];
  Alloc local_80;
  void *local_38;
  
  puVar9 = *(ulong **)arrays;
  puVar2 = *(ulong **)(arrays + 8);
  if (puVar9 == puVar2) {
    *(undefined8 *)this = 0;
    *(undefined8 *)(this + 8) = 0;
  }
  else {
    uVar11 = (long)puVar2 - (long)puVar9;
    puVar3 = (ulong *)*puVar9;
    if (((ulong)puVar3 & 1) == 0) {
      uVar13 = *puVar3;
    }
    else {
      uVar13 = (ulong)puVar3 >> 3;
    }
    do {
      puVar4 = (undefined8 *)*puVar9;
      if (((ulong)puVar4 & 1) == 0) {
        iVar10 = (int)*puVar4;
      }
      else {
        iVar10 = (int)((ulong)puVar4 >> 3);
      }
      n = (int)uVar13;
      local_80.prev = (Alloc *)arrays;
      if (iVar10 != n) {
        fail("assertion %s failed at %s +%d\n","array.size() == array_size",
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_array_ops.cpp"
             ,0x1b3);
      }
      puVar9 = puVar9 + 2;
    } while (puVar9 != puVar2);
    local_90._0_8_ = &local_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"");
    local_b0 = (uint)(uVar11 >> 4);
    Write<signed_char>::Write(&local_a8,n * local_b0,(string *)local_90);
    local_80.ptr = this;
    if ((Alloc *)local_90._0_8_ != &local_80) {
      operator_delete((void *)local_90._0_8_,
                      CONCAT44(local_80.size._4_4_,(undefined4)local_80.size) + 1);
    }
    if (0 < (int)local_b0) {
      local_80._48_8_ = ZEXT48(local_b0 & 0x7fffffff);
      lVar12 = 8;
      uVar11 = 0;
      do {
        sVar5 = (local_80.prev)->size;
        local_80.next = *(Alloc **)((sVar5 - 8) + lVar12);
        if (((ulong)local_80.next & 7) == 0 && local_80.next != (Alloc *)0x0) {
          if (entering_parallel == '\x01') {
            local_80.next = (Alloc *)((local_80.next)->size * 8 + 1);
          }
          else {
            (local_80.next)->use_count = (local_80.next)->use_count + 1;
          }
        }
        pAVar6 = local_80.next;
        local_80.name._M_string_length = *(size_type *)(sVar5 + lVar12);
        local_90._0_8_ = local_a8.shared_alloc_.alloc;
        if (((ulong)local_a8.shared_alloc_.alloc & 7) == 0 &&
            local_a8.shared_alloc_.alloc != (Alloc *)0x0) {
          if (entering_parallel == '\x01') {
            local_90._0_8_ = (local_a8.shared_alloc_.alloc)->size * 8 + 1;
          }
          else {
            (local_a8.shared_alloc_.alloc)->use_count =
                 (local_a8.shared_alloc_.alloc)->use_count + 1;
          }
        }
        local_90._8_8_ = local_a8.shared_alloc_.direct_ptr;
        local_80.size._4_4_ = (undefined4)uVar11;
        bVar14 = local_80.next != (Alloc *)0x0;
        bVar15 = ((ulong)local_80.next & 7) == 0;
        local_80.name._M_dataplus._M_p = (pointer)local_80.next;
        if (bVar15 && bVar14) {
          if (entering_parallel == '\x01') {
            local_80.name._M_dataplus._M_p = (pointer)((local_80.next)->size * 8 + 1);
          }
          else {
            (local_80.next)->use_count = (local_80.next)->use_count + 1;
          }
        }
        local_80.size._0_4_ = local_b0;
        local_38 = (void *)local_80.name._M_string_length;
        parallel_for<Omega_h::interleave<signed_char>(std::vector<Omega_h::Read<signed_char>,std::allocator<Omega_h::Read<signed_char>>>)::_lambda(int)_1_>
                  (n,(type *)local_90,"interleave");
        _Var8._M_p = local_80.name._M_dataplus._M_p;
        if (((ulong)local_80.name._M_dataplus._M_p & 7) == 0 &&
            (Alloc *)local_80.name._M_dataplus._M_p != (Alloc *)0x0) {
          piVar1 = (int *)((long)local_80.name._M_dataplus._M_p + 0x30);
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            Alloc::~Alloc((Alloc *)local_80.name._M_dataplus._M_p);
            operator_delete(_Var8._M_p,0x48);
          }
        }
        uVar7 = local_90._0_8_;
        if ((local_90._0_8_ & 7) == 0 && (Alloc *)local_90._0_8_ != (Alloc *)0x0) {
          piVar1 = (int *)(local_90._0_8_ + 0x30);
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            Alloc::~Alloc((Alloc *)local_90._0_8_);
            operator_delete((void *)uVar7,0x48);
          }
        }
        if (bVar15 && bVar14) {
          piVar1 = &pAVar6->use_count;
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            Alloc::~Alloc(pAVar6);
            operator_delete(pAVar6,0x48);
          }
        }
        uVar11 = uVar11 + 1;
        lVar12 = lVar12 + 0x10;
      } while (local_80._48_8_ != uVar11);
    }
    this = (Omega_h *)local_80.ptr;
    local_80.name.field_2._M_allocated_capacity = (size_type)local_a8.shared_alloc_.alloc;
    local_80.name.field_2._8_8_ = local_a8.shared_alloc_.direct_ptr;
    if ((((ulong)local_a8.shared_alloc_.alloc & 7) == 0 &&
         local_a8.shared_alloc_.alloc != (Alloc *)0x0) && (entering_parallel == '\x01')) {
      (local_a8.shared_alloc_.alloc)->use_count = (local_a8.shared_alloc_.alloc)->use_count + -1;
      local_80.name.field_2._M_allocated_capacity = (local_a8.shared_alloc_.alloc)->size * 8 + 1;
    }
    local_a8.shared_alloc_.alloc = (Alloc *)0x0;
    local_a8.shared_alloc_.direct_ptr = (void *)0x0;
    Read<signed_char>::Read
              ((Read<signed_char> *)local_80.ptr,(Write<signed_char> *)&local_80.name.field_2);
    uVar7 = local_80.name.field_2._M_allocated_capacity;
    in_RDX = extraout_RDX;
    if ((local_80.name.field_2._M_allocated_capacity & 7) == 0 &&
        (Alloc *)local_80.name.field_2._M_allocated_capacity != (Alloc *)0x0) {
      piVar1 = (int *)(local_80.name.field_2._M_allocated_capacity + 0x30);
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc((Alloc *)local_80.name.field_2._M_allocated_capacity);
        operator_delete((void *)uVar7,0x48);
        in_RDX = extraout_RDX_00;
      }
    }
    pAVar6 = local_a8.shared_alloc_.alloc;
    if (((ulong)local_a8.shared_alloc_.alloc & 7) == 0 &&
        local_a8.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_a8.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_a8.shared_alloc_.alloc);
        operator_delete(pAVar6,0x48);
        in_RDX = extraout_RDX_01;
      }
    }
  }
  RVar16.write_.shared_alloc_.direct_ptr = in_RDX;
  RVar16.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Read<signed_char>)RVar16.write_.shared_alloc_;
}

Assistant:

Read<T> interleave(std::vector<Read<T>> arrays) {
  if (arrays.empty()) return Read<T>();
  auto narrays = LO(arrays.size());
  auto array_size = arrays.front().size();
  for (auto& array : arrays) OMEGA_H_CHECK(array.size() == array_size);
  auto out_size = narrays * array_size;
  auto out = Write<T>(out_size);
  for (LO i = 0; i < narrays; ++i) {
    auto array = arrays[std::size_t(i)];
    auto f = OMEGA_H_LAMBDA(LO j) { out[j * narrays + i] = array[j]; };
    parallel_for(array_size, f, "interleave");
  }
  return out;
}